

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetric_difference_iterator.hpp
# Opt level: O3

void __thiscall
burst::
symmetric_difference_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
::maintain_invariant
          (symmetric_difference_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
           *this)

{
  __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
  _Var1;
  __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
  last;
  iterator_range<const_int_*> *piVar2;
  undefined8 unaff_RBX;
  
  _Var1._M_current = (this->m_begin)._M_current;
  last._M_current = (this->m_end)._M_current;
  while( true ) {
    _Var1 = select_min<__gnu_cxx::__normal_iterator<boost::iterator_range<int_const*>*,std::vector<boost::iterator_range<int_const*>,std::allocator<boost::iterator_range<int_const*>>>>,burst::compose_fn<burst::apply_fn<std::less<void>>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>>
                      (_Var1,last,SUB83(unaff_RBX,0));
    (this->m_min_end)._M_current = _Var1._M_current;
    piVar2 = (this->m_begin)._M_current;
    if ((_Var1._M_current == piVar2) || (((int)_Var1._M_current - (int)piVar2 & 0x10U) != 0)) break;
    do {
      (piVar2->super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
      ).super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
      super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.m_Begin
           = (piVar2->
             super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>).
             super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
             super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.
             m_Begin + 1;
      piVar2 = piVar2 + 1;
    } while (piVar2 != _Var1._M_current);
    last = std::
           __remove_if<__gnu_cxx::__normal_iterator<boost::iterator_range<int_const*>*,std::vector<boost::iterator_range<int_const*>,std::allocator<boost::iterator_range<int_const*>>>>,__gnu_cxx::__ops::_Iter_pred<burst::symmetric_difference_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<int_const*>*,std::vector<boost::iterator_range<int_const*>,std::allocator<boost::iterator_range<int_const*>>>>,std::less<void>>::remove_empty_ranges()::_lambda(auto:1_const&)_1_>>
                     ((this->m_begin)._M_current,(this->m_end)._M_current);
    (this->m_end)._M_current = last._M_current;
    _Var1._M_current = (this->m_begin)._M_current;
  }
  return;
}

Assistant:

void maintain_invariant ()
        {
            m_min_end = select_min(m_begin, m_end, each(front) | m_compare);
            while (m_min_end != m_begin && std::distance(m_begin, m_min_end) % 2 == 0)
            {
                std::for_each(m_begin, m_min_end, [] (auto & r) {r.advance_begin(1);});
                remove_empty_ranges();
                m_min_end = select_min(m_begin, m_end, each(front) | m_compare);
            }
        }